

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

QString * operator+(ProString *one,ProString *two)

{
  int iVar1;
  QChar *pQVar2;
  QChar *pQVar3;
  QChar *pQVar4;
  long in_RDX;
  long in_RSI;
  QString *in_RDI;
  ushort *ptr;
  QString *neu;
  ProString *in_stack_ffffffffffffffb8;
  
  if (*(int *)(in_RDX + 0x1c) == 0) {
    ProString::toQString(in_stack_ffffffffffffffb8);
  }
  else if (*(int *)(in_RSI + 0x1c) == 0) {
    ProString::toQString(in_stack_ffffffffffffffb8);
  }
  else {
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QString::QString(in_RDI,(long)(*(int *)(in_RSI + 0x1c) + *(int *)(in_RDX + 0x1c)),Uninitialized)
    ;
    pQVar2 = QString::constData((QString *)0x112150);
    pQVar4 = pQVar2;
    pQVar3 = QString::constData((QString *)0x112168);
    memcpy(pQVar4,pQVar3 + *(int *)(in_RSI + 0x18),(long)(*(int *)(in_RSI + 0x1c) << 1));
    iVar1 = *(int *)(in_RSI + 0x1c);
    pQVar4 = QString::constData((QString *)0x1121b3);
    memcpy(pQVar2 + iVar1,pQVar4 + *(int *)(in_RDX + 0x18),(long)(*(int *)(in_RDX + 0x1c) << 1));
  }
  return in_RDI;
}

Assistant:

QString operator+(const ProString &one, const ProString &two)
{
    if (two.m_length) {
        if (!one.m_length) {
            return two.toQString();
        } else {
            QString neu(one.m_length + two.m_length, Qt::Uninitialized);
            ushort *ptr = (ushort *)neu.constData();
            memcpy(ptr, one.m_string.constData() + one.m_offset, one.m_length * 2);
            memcpy(ptr + one.m_length, two.m_string.constData() + two.m_offset, two.m_length * 2);
            return neu;
        }
    }
    return one.toQString();
}